

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_snapshots.cpp
# Opt level: O1

bool writeError(path *fname,FILE **fileToClose)

{
  pointer pcVar1;
  int iVar2;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
  Error("Write error (disk full?)",(char *)local_38[0],IF_FIRST);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  iVar2 = fclose((FILE *)*fileToClose);
  return SUB41(iVar2,0);
}

Assistant:

static bool writeError(const std::filesystem::path & fname, FILE* & fileToClose) {
	Error("Write error (disk full?)", fname.string().c_str(), IF_FIRST);
	fclose(fileToClose);
	return false;
}